

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiScanlinePartThreading.cpp
# Opt level: O1

void testMultiScanlinePartThreading(string *tempDir)

{
  pointer pcVar1;
  size_t sVar2;
  void *pvVar3;
  pointer pOVar4;
  pointer pOVar5;
  Header *pHVar6;
  Header *pHVar7;
  pointer pIVar8;
  _Alloc_hider _Var9;
  char cVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ostream *poVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  ThreadPool *pTVar19;
  Task *pTVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  float *pfVar23;
  float *pfVar24;
  int *piVar25;
  ChannelList *this;
  ChannelList *pCVar26;
  long *plVar27;
  ulong uVar28;
  ulong uVar29;
  undefined4 uVar30;
  undefined1 *puVar31;
  ulong uVar32;
  MultiPartOutputFile *pMVar33;
  int i;
  Header *this_00;
  int y;
  long lVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  FrameBuffer *pFVar38;
  ulong uVar39;
  char **ppcVar40;
  bool bVar41;
  bool bVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar51;
  int iVar52;
  int iVar53;
  long local_378;
  int local_36c;
  int pixelTypes [2];
  ulong local_360;
  vector<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_> parts;
  Header header;
  vector<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_> parts_1;
  string fn;
  InputPart part_1;
  undefined4 local_2a0;
  int local_29c;
  OutputPart part;
  long alStack_290 [5];
  MultiPartOutputFile file;
  long alStack_260 [6];
  string *local_230;
  MultiPartInputFile file_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  int local_208 [2];
  undefined8 uStack_200;
  char *local_1f8;
  char *local_1f0 [4];
  long local_1d0;
  long local_1c8 [2];
  FrameBuffer frameBuffers [2];
  ios_base local_138 [264];
  long lVar50;
  
  local_230 = tempDir;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing the two threads reading/writing on two-scanline-part file",0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  IlmThread_3_4::ThreadPool::globalThreadPool();
  local_2a0 = IlmThread_3_4::ThreadPool::numThreads();
  iVar11 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar11);
  local_208[0] = -0x80000000;
  local_208[1] = 0x80000000;
  uStack_200._0_4_ = 0x80000000;
  uStack_200._4_4_ = 0x80000000;
  local_36c = 0;
  do {
    iVar11 = 0;
    do {
      pixelTypes[1] = iVar11;
      fn._M_dataplus._M_p = (pointer)&fn.field_2;
      pixelTypes[0] = local_36c;
      pcVar1 = (local_230->_M_dataplus)._M_p;
      local_29c = pixelTypes[1];
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fn,pcVar1,pcVar1 + local_230->_M_string_length);
      std::__cxx11::string::append((char *)&fn);
      lVar13 = 0x10;
      do {
        puVar31 = (undefined1 *)((long)local_1f0 + lVar13 + -8);
        *(undefined1 **)((long)local_208 + lVar13) = puVar31;
        *(undefined8 *)((long)&uStack_200 + lVar13) = 0;
        *puVar31 = 0;
        lVar13 = lVar13 + 0x20;
      } while (lVar13 != 0x50);
      ppcVar40 = &local_1f8;
      lVar13 = 0;
      do {
        if ((ulong)(uint)pixelTypes[lVar13] < 3) {
          std::__cxx11::string::_M_replace
                    ((ulong)ppcVar40,0,ppcVar40[1],
                     (ulong)(&DAT_001bfeac +
                            *(int *)(&DAT_001bfeac + (ulong)(uint)pixelTypes[lVar13] * 4)));
        }
        lVar13 = lVar13 + 1;
        ppcVar40 = ppcVar40 + 4;
      } while (lVar13 == 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"part 1: ",8);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_1f8,(long)local_1f0[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," scanline part, ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"part 2: ",8);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f0[3],local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," scanline part. ",0x10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers ",0x13);
      std::ostream::flush();
      pHVar7 = DAT_001ebd60;
      pHVar6 = (anonymous_namespace)::headers;
      this_00 = (anonymous_namespace)::headers;
      if (DAT_001ebd60 != (anonymous_namespace)::headers) {
        do {
          Imf_3_4::Header::~Header(this_00);
          this_00 = this_00 + 0x38;
        } while (this_00 != pHVar7);
        DAT_001ebd60 = pHVar6;
      }
      lVar13 = 0;
      do {
        frameBuffers[0]._map._M_t._M_impl._0_8_ = 0;
        Imf_3_4::Header::Header
                  (&header,0xc5,0x107,1.0,(Vec2 *)frameBuffers,1.0,INCREASING_Y,ZIP_COMPRESSION);
        iVar11 = pixelTypes[lVar13];
        std::__cxx11::stringstream::stringstream((stringstream *)frameBuffers);
        std::ostream::operator<<
                  (&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                   (int)lVar13);
        std::__cxx11::stringbuf::str();
        Imf_3_4::Header::setName((string *)&header);
        if (parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&parts.
                      super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(parts.
                          super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)(parts.
                                  super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (iVar11 == 0) {
          pcVar15 = (char *)Imf_3_4::Header::channels();
          Imf_3_4::Channel::Channel((Channel *)&parts,UINT,1,1,false);
          Imf_3_4::ChannelList::insert(pcVar15,(Channel *)"UINT");
        }
        else if (iVar11 == 1) {
          pcVar15 = (char *)Imf_3_4::Header::channels();
          Imf_3_4::Channel::Channel((Channel *)&parts,FLOAT,1,1,false);
          Imf_3_4::ChannelList::insert(pcVar15,(Channel *)"FLOAT");
        }
        else if (iVar11 == 2) {
          pcVar15 = (char *)Imf_3_4::Header::channels();
          Imf_3_4::Channel::Channel((Channel *)&parts,HALF,1,1,false);
          Imf_3_4::ChannelList::insert(pcVar15,(Channel *)"HALF");
        }
        Imf_3_4::Header::setType((string *)&header);
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                  ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                   &(anonymous_namespace)::headers,&header);
        std::__cxx11::stringstream::~stringstream((stringstream *)frameBuffers);
        std::ios_base::~ios_base(local_138);
        Imf_3_4::Header::~Header(&header);
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing files ",0xe)
      ;
      std::ostream::flush();
      pcVar16 = (char *)operator_new__(0x3298c);
      uVar12 = 1;
      uVar32 = 0;
      lVar13 = 0;
      pcVar15 = pcVar16;
      do {
        lVar34 = 1;
        iVar11 = (int)uVar32;
        auVar44 = _DAT_001b6b00;
        uVar36 = uVar12;
        do {
          if (SUB164(auVar44 ^ _DAT_001b6b10,4) == local_208[0] &&
              SUB164(auVar44 ^ _DAT_001b6b10,0) < -0x7fffff3b) {
            *(int *)(pcVar15 + lVar34 * 4 + -4) = (int)uVar32 + (int)(uVar32 / 0x801) * -0x801;
            *(uint *)(pcVar15 + lVar34 * 4) = uVar36 % 0x801;
          }
          lVar50 = auVar44._8_8_;
          auVar44._0_8_ = auVar44._0_8_ + 2;
          auVar44._8_8_ = lVar50 + 2;
          uVar36 = uVar36 + 2;
          lVar34 = lVar34 + 2;
          uVar32 = (ulong)((int)uVar32 + 2);
        } while (lVar34 != 199);
        lVar13 = lVar13 + 1;
        uVar12 = uVar12 + 0xc5;
        pcVar15 = pcVar15 + 0x314;
        uVar32 = (ulong)(iVar11 + 0xc5);
      } while (lVar13 != 0x107);
      pcVar17 = (char *)operator_new__(0x194c6);
      testMultiScanlinePartThreading();
      pcVar18 = (char *)operator_new__(0x3298c);
      uVar12 = 1;
      uVar36 = 0;
      lVar13 = 0;
      pcVar15 = pcVar18;
      do {
        lVar34 = 1;
        auVar45 = _DAT_001b6b00;
        uVar37 = uVar12;
        uVar35 = uVar36;
        do {
          if (SUB164(auVar45 ^ _DAT_001b6b10,4) == local_208[0] &&
              SUB164(auVar45 ^ _DAT_001b6b10,0) < -0x7fffff3b) {
            *(float *)(pcVar15 + lVar34 * 4 + -4) = (float)(uVar35 % 0x801);
            *(float *)(pcVar15 + lVar34 * 4) = (float)(uVar37 % 0x801);
          }
          lVar50 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + 2;
          auVar45._8_8_ = lVar50 + 2;
          uVar37 = uVar37 + 2;
          lVar34 = lVar34 + 2;
          uVar35 = uVar35 + 2;
        } while (lVar34 != 199);
        lVar13 = lVar13 + 1;
        uVar12 = uVar12 + 0xc5;
        pcVar15 = pcVar15 + 0x314;
        uVar36 = uVar36 + 0xc5;
      } while (lVar13 != 0x107);
      remove(fn._M_dataplus._M_p);
      _Var9 = fn._M_dataplus;
      pHVar7 = DAT_001ebd60;
      pHVar6 = (anonymous_namespace)::headers;
      iVar11 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (&file,_Var9._M_p,pHVar6,
                 (int)((ulong)((long)pHVar7 - (long)pHVar6) >> 3) * -0x49249249,false,iVar11);
      parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar13 = 0;
      do {
        lVar34 = (long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 lVar13;
        *(undefined4 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar13
         ) = 0;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
         lVar13) = 0;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 lVar13) = lVar34;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 + lVar13) = lVar34;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar13) = 0
        ;
        lVar13 = lVar13 + 0x30;
      } while (lVar13 != 0x60);
      pFVar38 = frameBuffers;
      lVar13 = 0;
      do {
        Imf_3_4::OutputPart::OutputPart(&part,&file,(int)lVar13);
        iVar11 = pixelTypes[lVar13];
        if (iVar11 == 2) {
          Imf_3_4::Slice::Slice((Slice *)&header,HALF,pcVar17,2,0x18a,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar38,(Slice *)"HALF");
        }
        else if (iVar11 == 1) {
          Imf_3_4::Slice::Slice((Slice *)&header,FLOAT,pcVar18,4,0x314,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar38,(Slice *)"FLOAT");
        }
        else if (iVar11 == 0) {
          Imf_3_4::Slice::Slice((Slice *)&header,UINT,pcVar16,4,0x314,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar38,(Slice *)"UINT");
        }
        Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&part);
        if (parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_4::OutputPart,std::allocator<Imf_3_4::OutputPart>>::
          _M_realloc_insert<Imf_3_4::OutputPart_const&>
                    ((vector<Imf_3_4::OutputPart,std::allocator<Imf_3_4::OutputPart>> *)&parts,
                     (iterator)
                     parts.
                     super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&part);
        }
        else {
          *(undefined8 *)
           parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
           _M_impl.super__Vector_impl_data._M_finish = _part;
          parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
               _M_impl.super__Vector_impl_data._M_finish + 8;
        }
        lVar13 = lVar13 + 1;
        pFVar38 = pFVar38 + 1;
      } while (lVar13 == 1);
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&header);
      pTVar19 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_4::ThreadPool::ThreadPool(pTVar19,2);
      iVar11 = 0x1a;
      do {
        pTVar20 = (Task *)operator_new(0x20);
        pOVar4 = parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_4::Task::Task(pTVar20,(TaskGroup *)&header);
        *(undefined ***)pTVar20 = &PTR__Task_001e62e8;
        *(pointer *)(pTVar20 + 0x10) = pOVar4;
        *(undefined4 *)(pTVar20 + 0x18) = 10;
        IlmThread_3_4::ThreadPool::addTask((Task *)pTVar19);
        pTVar20 = (Task *)operator_new(0x20);
        pOVar4 = parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_4::Task::Task(pTVar20,(TaskGroup *)&header);
        *(undefined ***)pTVar20 = &PTR__Task_001e62e8;
        *(pointer *)(pTVar20 + 0x10) = pOVar4 + 8;
        *(undefined4 *)(pTVar20 + 0x18) = 10;
        IlmThread_3_4::ThreadPool::addTask((Task *)pTVar19);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      pTVar20 = (Task *)operator_new(0x20);
      pOVar4 = parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
               _M_impl.super__Vector_impl_data._M_start;
      IlmThread_3_4::Task::Task(pTVar20,(TaskGroup *)&header);
      *(undefined ***)pTVar20 = &PTR__Task_001e62e8;
      *(pointer *)(pTVar20 + 0x10) = pOVar4;
      *(undefined4 *)(pTVar20 + 0x18) = 3;
      IlmThread_3_4::ThreadPool::addTask((Task *)pTVar19);
      pTVar20 = (Task *)operator_new(0x20);
      pOVar4 = parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
               _M_impl.super__Vector_impl_data._M_start;
      IlmThread_3_4::Task::Task(pTVar20,(TaskGroup *)&header);
      *(undefined ***)pTVar20 = &PTR__Task_001e62e8;
      *(pointer *)(pTVar20 + 0x10) = pOVar4 + 8;
      *(undefined4 *)(pTVar20 + 0x18) = 3;
      IlmThread_3_4::ThreadPool::addTask((Task *)pTVar19);
      (**(code **)(*(long *)pTVar19 + 8))(pTVar19);
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&header);
      lVar13 = 0x30;
      do {
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)(&frameBuffers[0]._map._M_t._M_impl.field_0x0 + lVar13));
        lVar13 = lVar13 + -0x30;
      } while (lVar13 != -0x30);
      if (parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(parts.
                        super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)parts.
                              super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)parts.
                              super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&file);
      operator_delete__(pcVar16);
      operator_delete__(pcVar18);
      operator_delete__(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Checking headers ",0x11);
      std::ostream::flush();
      _Var9 = fn._M_dataplus;
      iVar11 = Imf_3_4::globalThreadCount();
      uVar32 = 1;
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(&file_1,_Var9._M_p,iVar11,true);
      iVar11 = Imf_3_4::MultiPartInputFile::parts();
      if (iVar11 != 2) {
        __assert_fail("file.parts () == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                      ,0x134,"void (anonymous namespace)::readFiles(int *, const std::string &)");
      }
      lVar13 = 0;
      do {
        uVar30 = (undefined4)uVar32;
        Imf_3_4::MultiPartInputFile::header((int)&file_1);
        puVar21 = (undefined8 *)Imf_3_4::Header::displayWindow();
        puVar22 = (undefined8 *)Imf_3_4::Header::displayWindow();
        iVar11 = -(uint)((int)*puVar22 == (int)*puVar21);
        iVar52 = -(uint)((int)((ulong)*puVar22 >> 0x20) == (int)((ulong)*puVar21 >> 0x20));
        auVar46._4_4_ = iVar11;
        auVar46._0_4_ = iVar11;
        auVar46._8_4_ = iVar52;
        auVar46._12_4_ = iVar52;
        iVar11 = movmskpd(uVar30,auVar46);
        if ((iVar11 != 3) ||
           (iVar52 = -(uint)((int)puVar22[1] == (int)puVar21[1]),
           iVar53 = -(uint)((int)((ulong)puVar22[1] >> 0x20) == (int)((ulong)puVar21[1] >> 0x20)),
           auVar47._4_4_ = iVar52, auVar47._0_4_ = iVar52, auVar47._8_4_ = iVar53,
           auVar47._12_4_ = iVar53, iVar52 = movmskpd((int)puVar22,auVar47), iVar52 != 3)) {
          __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x138,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar21 = (undefined8 *)Imf_3_4::Header::dataWindow();
        puVar22 = (undefined8 *)Imf_3_4::Header::dataWindow();
        iVar52 = -(uint)((int)*puVar22 == (int)*puVar21);
        iVar53 = -(uint)((int)((ulong)*puVar22 >> 0x20) == (int)((ulong)*puVar21 >> 0x20));
        auVar48._4_4_ = iVar52;
        auVar48._0_4_ = iVar52;
        auVar48._8_4_ = iVar53;
        auVar48._12_4_ = iVar53;
        uVar12 = movmskpd(iVar11,auVar48);
        uVar32 = (ulong)uVar12;
        if ((uVar12 != 3) ||
           (iVar11 = -(uint)((int)puVar22[1] == (int)puVar21[1]),
           iVar52 = -(uint)((int)((ulong)puVar22[1] >> 0x20) == (int)((ulong)puVar21[1] >> 0x20)),
           auVar49._4_4_ = iVar11, auVar49._0_4_ = iVar11, auVar49._8_4_ = iVar52,
           auVar49._12_4_ = iVar52, iVar11 = movmskpd((int)puVar22,auVar49), iVar11 != 3)) {
          __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x139,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar23 = (float *)Imf_3_4::Header::pixelAspectRatio();
        fVar43 = *pfVar23;
        pfVar23 = (float *)Imf_3_4::Header::pixelAspectRatio();
        if ((fVar43 != *pfVar23) || (NAN(fVar43) || NAN(*pfVar23))) {
          __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13a,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar23 = (float *)Imf_3_4::Header::screenWindowCenter();
        pfVar24 = (float *)Imf_3_4::Header::screenWindowCenter();
        if ((((*pfVar23 != *pfVar24) || (NAN(*pfVar23) || NAN(*pfVar24))) ||
            (pfVar23[1] != pfVar24[1])) || (NAN(pfVar23[1]) || NAN(pfVar24[1]))) {
          __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13c,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar23 = (float *)Imf_3_4::Header::screenWindowWidth();
        fVar43 = *pfVar23;
        pfVar23 = (float *)Imf_3_4::Header::screenWindowWidth();
        if ((fVar43 != *pfVar23) || (NAN(fVar43) || NAN(*pfVar23))) {
          __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13d,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        piVar25 = (int *)Imf_3_4::Header::lineOrder();
        iVar11 = *piVar25;
        piVar25 = (int *)Imf_3_4::Header::lineOrder();
        if (iVar11 != *piVar25) {
          __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13e,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        piVar25 = (int *)Imf_3_4::Header::compression();
        iVar11 = *piVar25;
        piVar25 = (int *)Imf_3_4::Header::compression();
        if (iVar11 != *piVar25) {
          __assert_fail("header.compression () == headers[i].compression ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13f,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        this = (ChannelList *)Imf_3_4::Header::channels();
        pCVar26 = (ChannelList *)Imf_3_4::Header::channels();
        cVar10 = Imf_3_4::ChannelList::operator==(this,pCVar26);
        if (cVar10 == '\0') {
          __assert_fail("header.channels () == headers[i].channels ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x140,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar21 = (undefined8 *)Imf_3_4::Header::name_abi_cxx11_();
        puVar22 = (undefined8 *)Imf_3_4::Header::name_abi_cxx11_();
        sVar2 = puVar21[1];
        if ((sVar2 != puVar22[1]) ||
           ((sVar2 != 0 && (iVar11 = bcmp((void *)*puVar21,(void *)*puVar22,sVar2), iVar11 != 0))))
        {
          __assert_fail("header.name () == headers[i].name ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x141,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar21 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        puVar22 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        sVar2 = puVar21[1];
        if ((sVar2 != puVar22[1]) ||
           ((sVar2 != 0 && (iVar11 = bcmp((void *)*puVar21,(void *)*puVar22,sVar2), iVar11 != 0))))
        {
          __assert_fail("header.type () == headers[i].type ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x142,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0);
      alStack_260[3] = 0;
      alStack_260[4] = 0;
      alStack_260[1] = 0;
      alStack_260[2] = 0;
      _file = 0;
      alStack_260[0] = 0;
      alStack_290[3] = 0;
      alStack_290[4] = 0;
      alStack_290[1] = 0;
      alStack_290[2] = 0;
      _part = 0;
      alStack_290[0] = 0;
      parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar13 = 0;
      do {
        lVar34 = (long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 lVar13;
        *(undefined4 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar13
         ) = 0;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
         lVar13) = 0;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 lVar13) = lVar34;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 + lVar13) = lVar34;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar13) = 0
        ;
        lVar13 = lVar13 + 0x30;
      } while (lVar13 != 0x60);
      pFVar38 = frameBuffers;
      lVar13 = 0;
      lVar34 = 0;
      do {
        Imf_3_4::InputPart::InputPart(&part_1,&file_1,(int)lVar34);
        iVar11 = pixelTypes[lVar34];
        if (iVar11 == 2) {
          pcVar15 = (char *)operator_new__(0x194c6);
          pvVar3 = *(void **)((long)alStack_290 + lVar13 + 8);
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          *(undefined8 *)(&part + lVar13) = 0x107;
          *(undefined8 *)((long)alStack_290 + lVar13) = 0xc5;
          *(char **)((long)alStack_290 + lVar13 + 8) = pcVar15;
          Imf_3_4::Slice::Slice((Slice *)&header,HALF,pcVar15,2,0x18a,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar38,(Slice *)"HALF");
        }
        else if (iVar11 == 1) {
          pcVar15 = (char *)operator_new__(0x3298c);
          pvVar3 = *(void **)((long)alStack_260 + lVar13 + 8);
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          *(undefined8 *)(&file + lVar13) = 0x107;
          *(undefined8 *)((long)alStack_260 + lVar13) = 0xc5;
          *(char **)((long)alStack_260 + lVar13 + 8) = pcVar15;
          Imf_3_4::Slice::Slice((Slice *)&header,FLOAT,pcVar15,4,0x314,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar38,(Slice *)"FLOAT");
        }
        else if (iVar11 == 0) {
          pcVar15 = (char *)operator_new__(0x3298c);
          pvVar3 = *(void **)((long)&parts.
                                     super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13);
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          *(undefined8 *)
           ((long)&parts.
                   super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar13) = 0x107;
          *(undefined8 *)
           ((long)&parts.
                   super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
                   _M_impl.super__Vector_impl_data._M_finish + lVar13) = 0xc5;
          *(char **)((long)&parts.
                            super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) = pcVar15;
          Imf_3_4::Slice::Slice((Slice *)&header,UINT,pcVar15,4,0x314,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar38,(Slice *)"UINT");
        }
        Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&part_1);
        if (parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_4::InputPart,std::allocator<Imf_3_4::InputPart>>::
          _M_realloc_insert<Imf_3_4::InputPart_const&>
                    ((vector<Imf_3_4::InputPart,std::allocator<Imf_3_4::InputPart>> *)&parts_1,
                     (iterator)
                     parts_1.
                     super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&part_1);
        }
        else {
          *(undefined8 *)
           parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>.
           _M_impl.super__Vector_impl_data._M_finish = _part_1;
          parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>.
               _M_impl.super__Vector_impl_data._M_finish + 8;
        }
        lVar34 = lVar34 + 1;
        lVar13 = lVar13 + 0x18;
        pFVar38 = pFVar38 + 1;
      } while (lVar13 == 0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading files ",0xe)
      ;
      std::ostream::flush();
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&header);
      pTVar19 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_4::ThreadPool::ThreadPool(pTVar19,2);
      iVar11 = 0;
      do {
        pTVar20 = (Task *)operator_new(0x20);
        pIVar8 = parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_4::Task::Task(pTVar20,(TaskGroup *)&header);
        *(undefined ***)pTVar20 = &PTR__Task_001e6328;
        *(pointer *)(pTVar20 + 0x10) = pIVar8;
        *(int *)(pTVar20 + 0x18) = iVar11;
        IlmThread_3_4::ThreadPool::addTask((Task *)pTVar19);
        pTVar20 = (Task *)operator_new(0x20);
        pIVar8 = parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_4::Task::Task(pTVar20,(TaskGroup *)&header);
        *(undefined ***)pTVar20 = &PTR__Task_001e6328;
        *(pointer *)(pTVar20 + 0x10) = pIVar8 + 8;
        *(int *)(pTVar20 + 0x18) = iVar11;
        IlmThread_3_4::ThreadPool::addTask((Task *)pTVar19);
        iVar11 = iVar11 + 10;
      } while (iVar11 != 0x10e);
      (**(code **)(*(long *)pTVar19 + 8))(pTVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comparing",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      std::ostream::flush();
      lVar13 = 0;
      do {
        iVar11 = pixelTypes[lVar13];
        if (iVar11 == 2) {
          uVar12 = 0;
          lVar34 = 0;
          uVar32 = 0;
          local_360 = 0;
          do {
            uVar39 = 0;
            bVar42 = false;
            uVar36 = uVar12;
            do {
              iVar11 = (int)uVar39;
              fVar43 = (float)(int)(uVar12 + (uVar36 / 0x801) * -0x801 + iVar11);
              if ((uint)fVar43 < 0x38800000) {
                if ((uint)fVar43 < 0x33000001) {
                  uVar29 = 0;
                }
                else {
                  cVar10 = (char)((uint)fVar43 >> 0x17);
                  uVar35 = (uint)fVar43 & 0x7fffff | 0x800000;
                  uVar37 = uVar35 >> (0x7eU - cVar10 & 0x1f);
                  uVar29 = (ulong)uVar37;
                  if (0x80000000 < uVar35 << (cVar10 + 0xa2U & 0x1f)) {
                    uVar29 = (ulong)(uVar37 + 1);
                  }
                }
              }
              else if ((uint)fVar43 < 0x7f800000) {
                if ((uint)fVar43 < 0x477ff000) {
                  uVar29 = (ulong)((int)fVar43 + 0x8000fff + (uint)(((uint)fVar43 >> 0xd & 1) != 0)
                                  >> 0xd);
                }
                else {
                  uVar29 = 0x7c00;
                }
              }
              else {
                uVar29 = 0x7c00;
                if (fVar43 != INFINITY) {
                  uVar37 = (uint)fVar43 >> 0xd & 0x3ff;
                  uVar29 = (ulong)(uVar37 == 0 | uVar37 | 0x7c00);
                }
              }
              fVar43 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)
                                         (alStack_290[lVar13 * 3] * lVar34 +
                                          alStack_290[lVar13 * 3 + 1] + uVar39 * 2) * 4);
              pfVar23 = (float *)(_imath_half_to_float_table + (uVar29 & 0xffff) * 4);
              if ((fVar43 != *pfVar23) || (NAN(fVar43) || NAN(*pfVar23))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar14 = (ostream *)std::ostream::operator<<(&std::cout,iVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)uVar32);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
                poVar14 = (ostream *)
                          operator<<(poVar14,(half)*(uint16_t *)
                                                    (alStack_290[lVar13 * 3] * lVar34 +
                                                     alStack_290[lVar13 * 3 + 1] + uVar39 * 2));
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,", should be ",0xc);
                uVar39 = (ulong)((uVar36 / 0x801) * 0x801);
                plVar27 = (long *)std::ostream::operator<<
                                            (poVar14,uVar12 + (uVar36 / 0x801) * -0x801 + iVar11);
                std::ios::widen((char)*(undefined8 *)(*plVar27 + -0x18) + (char)plVar27);
                std::ostream::put((char)plVar27);
                std::ostream::flush();
                std::ostream::flush();
                if (!bVar42) goto LAB_00183225;
                goto LAB_001831f9;
              }
              bVar42 = 0xc3 < uVar39;
              uVar39 = uVar39 + 1;
              uVar36 = uVar36 + 1;
            } while (uVar39 != 0xc5);
            uVar39 = 0;
LAB_001831f9:
            bVar42 = 0x105 < uVar32;
            uVar32 = uVar32 + 1;
            local_360 = CONCAT71((int7)(uVar39 >> 8),bVar42);
            lVar34 = lVar34 + 2;
            uVar12 = uVar12 + 0xc5;
          } while (uVar32 != 0x107);
LAB_00183225:
          if ((local_360 & 1) == 0) {
            __assert_fail("checkPixels<half> (hData[i], width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                          ,0x17d,"void (anonymous namespace)::readFiles(int *, const std::string &)"
                         );
          }
        }
        else if (iVar11 == 1) {
          local_378 = 0;
          uVar39 = 1;
          pMVar33 = (MultiPartOutputFile *)0x0;
          uVar32 = 0;
          local_360 = 0;
          do {
            uVar12 = (uint)((int)uVar32 * 0xc5) % 0x801;
            fVar43 = *(float *)(alStack_260[lVar13 * 3 + 1] + alStack_260[lVar13 * 3] * uVar32 * 4);
            iVar11 = (int)pMVar33;
            iVar52 = (int)uVar39;
            if ((fVar43 != (float)uVar12) || (NAN(fVar43) || NAN((float)uVar12))) {
              lVar34 = 0;
              bVar42 = false;
            }
            else {
              uVar29 = 0xffffffffffffffff;
              do {
                uVar28 = uVar29;
                if (uVar28 == 0xc3) goto LAB_00182f49;
                fVar43 = *(float *)(alStack_260[lVar13 * 3 + 1] +
                                    alStack_260[lVar13 * 3] * local_378 + 8 + uVar28 * 4);
                fVar51 = (float)(iVar52 + (int)(uVar39 / 0x801) * -0x801 + (int)uVar28 + 1);
                uVar29 = uVar28 + 1;
                uVar12 = (int)pMVar33 + 1;
                pMVar33 = (MultiPartOutputFile *)(ulong)uVar12;
                uVar39 = (ulong)((int)uVar39 + 1);
              } while ((fVar43 == fVar51) && (!NAN(fVar43) && !NAN(fVar51)));
              bVar42 = 0xc3 < uVar29;
              lVar34 = uVar28 + 2;
              uVar12 = iVar11 + (uVar12 / 0x801) * -0x801 + (int)uVar29 + 1;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar14 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar34);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)uVar32);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
            pMVar33 = &file + lVar13 * 0x18;
            poVar14 = std::ostream::_M_insert<double>
                                ((double)*(float *)(alStack_260[lVar13 * 3] * uVar32 * 4 +
                                                    alStack_260[lVar13 * 3 + 1] + lVar34 * 4));
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,", should be ",0xc);
            plVar27 = (long *)std::ostream::operator<<(poVar14,uVar12);
            std::ios::widen((char)*(undefined8 *)(*plVar27 + -0x18) + (char)plVar27);
            std::ostream::put((char)plVar27);
            std::ostream::flush();
            std::ostream::flush();
            if (!bVar42) break;
LAB_00182f49:
            bVar42 = 0x105 < uVar32;
            uVar32 = uVar32 + 1;
            local_360 = CONCAT71((int7)((ulong)pMVar33 >> 8),bVar42);
            pMVar33 = (MultiPartOutputFile *)(ulong)(iVar11 + 0xc5);
            uVar39 = (ulong)(iVar52 + 0xc5);
            local_378 = local_378 + 4;
          } while (uVar32 != 0x107);
          if ((local_360 & 1) == 0) {
            __assert_fail("checkPixels<float> (fData[i], width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                          ,0x17b,"void (anonymous namespace)::readFiles(int *, const std::string &)"
                         );
          }
        }
        else if (iVar11 == 0) {
          lVar34 = 0;
          uVar12 = 0;
          uVar32 = 0;
          bVar42 = false;
          do {
            pOVar4 = (&parts)[lVar13].
                     super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pOVar5 = (&parts)[lVar13].
                     super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar36 = (uint)((int)uVar32 * 0xc5) % 0x801;
            if (*(uint *)(pOVar5 + (long)pOVar4 * uVar32 * 4) == uVar36) {
              uVar39 = 0;
              uVar36 = uVar12;
              do {
                uVar29 = uVar39;
                if (uVar29 == 0xc4) goto LAB_00182d08;
                uVar39 = uVar29 + 1;
                uVar36 = uVar36 + 1;
              } while (uVar12 + (uVar36 / 0x801) * -0x801 + (int)uVar39 ==
                       *(int *)(pOVar5 + uVar29 * 4 + (long)pOVar4 * lVar34 + 4));
              bVar41 = 0xc3 < uVar29;
              uVar36 = (int)uVar39 + uVar12 + (uVar36 / 0x801) * -0x801;
            }
            else {
              uVar39 = 0;
              bVar41 = false;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar14 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar39);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
            poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)uVar32);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
            poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,", should be ",0xc);
            plVar27 = (long *)std::ostream::operator<<(poVar14,uVar36);
            std::ios::widen((char)*(undefined8 *)(*plVar27 + -0x18) + (char)plVar27);
            std::ostream::put((char)plVar27);
            std::ostream::flush();
            std::ostream::flush();
            if (!bVar41) break;
LAB_00182d08:
            bVar42 = 0x105 < uVar32;
            uVar32 = uVar32 + 1;
            uVar12 = uVar12 + 0xc5;
            lVar34 = lVar34 + 4;
          } while (uVar32 != 0x107);
          if (!bVar42) {
            __assert_fail("checkPixels<unsigned int> (uData[i], width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                          ,0x178,"void (anonymous namespace)::readFiles(int *, const std::string &)"
                         );
          }
        }
        bVar42 = lVar13 == 0;
        lVar13 = lVar13 + 1;
      } while (bVar42);
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&header);
      lVar13 = 0x30;
      do {
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)(&frameBuffers[0]._map._M_t._M_impl.field_0x0 + lVar13));
        lVar13 = lVar13 + -0x30;
      } while (lVar13 != -0x30);
      if (parts_1.super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(parts_1.
                        super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)parts_1.
                              super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)parts_1.
                              super__Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar13 = 0x30;
      do {
        if (*(void **)((long)&local_2a0 + lVar13) != (void *)0x0) {
          operator_delete__(*(void **)((long)&local_2a0 + lVar13));
        }
        lVar13 = lVar13 + -0x18;
      } while (lVar13 != 0);
      lVar13 = 0x30;
      do {
        pvVar3 = *(void **)((long)alStack_290 + lVar13 + 0x20);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        lVar13 = lVar13 + -0x18;
      } while (lVar13 != 0);
      lVar13 = 0x30;
      do {
        if (*(void **)((long)&local_360 + lVar13) != (void *)0x0) {
          operator_delete__(*(void **)((long)&local_360 + lVar13));
        }
        lVar13 = lVar13 + -0x18;
      } while (lVar13 != 0);
      if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
      }
      if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
      }
      remove(fn._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      std::ostream::flush();
      lVar13 = -0x40;
      plVar27 = local_1c8;
      do {
        if (plVar27 != (long *)plVar27[-2]) {
          operator_delete((long *)plVar27[-2],*plVar27 + 1);
        }
        plVar27 = plVar27 + -4;
        lVar13 = lVar13 + 0x20;
      } while (lVar13 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fn._M_dataplus._M_p != &fn.field_2) {
        operator_delete(fn._M_dataplus._M_p,fn.field_2._M_allocated_capacity + 1);
      }
      iVar11 = local_29c + 1;
    } while (local_29c + 1 != 3);
    local_36c = local_36c + 1;
    if (local_36c == 3) {
      iVar11 = IlmThread_3_4::ThreadPool::globalThreadPool();
      IlmThread_3_4::ThreadPool::setNumThreads(iVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testMultiScanlinePartThreading (const std::string& tempDir)
{
    try
    {
        cout
            << "Testing the two threads reading/writing on two-scanline-part file"
            << endl;

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        int pixelTypes[2];

        for (int i = 0; i < 3; i++)
            for (int j = 0; j < 3; j++)
            {
                pixelTypes[0] = i;
                pixelTypes[1] = j;
                testWriteRead (pixelTypes, tempDir);
            }

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}